

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::AutoArray(NULLCAutoArray *arr,int type,uint count)

{
  ExternTypeInfo *pEVar1;
  ulong uVar2;
  char *pcVar3;
  uint count_local;
  int type_local;
  NULLCAutoArray *arr_local;
  
  if (arr == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),type);
    uVar2 = (ulong)count * (ulong)pEVar1->size;
    if (uVar2 < globalMemoryLimit || uVar2 - globalMemoryLimit == 0) {
      arr->typeID = type;
      arr->len = count;
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),type);
      pcVar3 = (char *)AllocObject(count * pEVar1->size,type);
      arr->ptr = pcVar3;
    }
    else {
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),type);
      nullcThrowError("ERROR: can\'t allocate array with %u elements of size %u",(ulong)count,
                      (ulong)pEVar1->size);
    }
  }
  return;
}

Assistant:

void NULLC::AutoArray(NULLCAutoArray* arr, int type, unsigned count)
{
	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	if((unsigned long long)count * linker->exTypes[type].size > globalMemoryLimit)
	{
		nullcThrowError("ERROR: can't allocate array with %u elements of size %u", count, linker->exTypes[type].size);
		return;
	}

	arr->typeID = type;
	arr->len = count;
	arr->ptr = (char*)AllocObject(count * linker->exTypes[type].size, type);
}